

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBaseClass.cpp
# Opt level: O3

void __thiscall
vkt::Draw::DrawTestsBaseClass::DrawTestsBaseClass
          (DrawTestsBaseClass *this,Context *context,char *vertexShaderName,char *fragmentShaderName
          ,VkPrimitiveTopology topology)

{
  DeviceInterface *pDVar1;
  allocator<char> local_32;
  allocator<char> local_31;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DrawTestsBaseClass_00d323b0;
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_topology = topology;
  pDVar1 = Context::getDeviceInterface(context);
  this->m_vk = pDVar1;
  memset(&this->m_pipeline,0,0x90);
  PipelineCreateInfo::VertexInputState::VertexInputState
            (&this->m_vertexInputState,0,(VkVertexInputBindingDescription *)0x0,0,
             (VkVertexInputAttributeDescription *)0x0);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,vertexShaderName,&local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,fragmentShaderName,&local_32);
  (this->m_data).
  super__Vector_base<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DrawTestsBaseClass::DrawTestsBaseClass (Context& context, const char* vertexShaderName, const char* fragmentShaderName, vk::VkPrimitiveTopology topology)
	: TestInstance				(context)
	, m_colorAttachmentFormat	(vk::VK_FORMAT_R8G8B8A8_UNORM)
	, m_topology				(topology)
	, m_vk						(context.getDeviceInterface())
	, m_vertexShaderName		(vertexShaderName)
	, m_fragmentShaderName		(fragmentShaderName)
{
}